

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O3

int64_t aom_sse_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < height) {
    lVar1 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          lVar1 = lVar1 + (ulong)(((uint)a[uVar2] - (uint)b[uVar2]) *
                                 ((uint)a[uVar2] - (uint)b[uVar2]));
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
    } while (iVar3 != height);
    return lVar1;
  }
  return 0;
}

Assistant:

int64_t aom_sse_c(const uint8_t *a, int a_stride, const uint8_t *b,
                  int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = abs(a[x] - b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}